

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateTest.hpp
# Opt level: O0

void Qentem::Test::TestRawVariableTag3(QTest *test)

{
  uint uVar1;
  StringStream<char> *pSVar2;
  Value<char> local_70;
  Value<char> local_58;
  char *local_40;
  char *content;
  Value<char> value;
  StringStream<char> ss;
  QTest *test_local;
  
  StringStream<char>::StringStream((StringStream<char> *)&value.type_);
  Value<char>::Value((Value<char> *)&content);
  local_40 = "{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,pSVar2,(char (*) [8])0x13199e,0x518);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:a}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,pSVar2,(char (*) [8])"{raw:a}",0x51b);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw:0[0]}";
  uVar1 = StringUtils::Count<char,unsigned_int>("{raw:0[0]}");
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:0[0]}",uVar1,(Value<char> *)&content,(StringStream<char> *)&value.type_)
  ;
  QTest::IsEqual<Qentem::StringStream<char>,char[11]>(test,pSVar2,(char (*) [11])"{raw:0[0]}",0x51f)
  ;
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw:a[0]}";
  uVar1 = StringUtils::Count<char,unsigned_int>("{raw:a[0]}");
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:a[0]}",uVar1,(Value<char> *)&content,(StringStream<char> *)&value.type_)
  ;
  QTest::IsEqual<Qentem::StringStream<char>,char[11]>(test,pSVar2,(char (*) [11])"{raw:a[0]}",0x523)
  ;
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw:0[a]}";
  uVar1 = StringUtils::Count<char,unsigned_int>("{raw:0[a]}");
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:0[a]}",uVar1,(Value<char> *)&content,(StringStream<char> *)&value.type_)
  ;
  QTest::IsEqual<Qentem::StringStream<char>,char[11]>(test,pSVar2,(char (*) [11])"{raw:0[a]}",0x527)
  ;
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw:a[abc]}";
  uVar1 = StringUtils::Count<char,unsigned_int>("{raw:a[abc]}");
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:a[abc]}",uVar1,(Value<char> *)&content,
                      (StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[13]>
            (test,pSVar2,(char (*) [13])"{raw:a[abc]}",0x52b);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  JSON::Parse<char>(&local_58,"[[[]],{\"a\":[\"x\"],\"b\":{\"a\":\"X\"}}]");
  Value<char>::operator=((Value<char> *)&content,&local_58);
  Value<char>::~Value(&local_58);
  local_40 = "{raw:0}";
  uVar1 = StringUtils::Count<char,unsigned_int>("{raw:0}");
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:0}",uVar1,(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,pSVar2,(char (*) [8])0x13199e,0x533);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw:0[0]}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:0[0]}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[11]>(test,pSVar2,(char (*) [11])"{raw:0[0]}",0x537)
  ;
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw:0[0][0]}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:0[0][0]}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[14]>
            (test,pSVar2,(char (*) [14])"{raw:0[0][0]}",0x53b);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw:1}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:1}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,pSVar2,(char (*) [8])"{raw:1}",0x541);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw:2}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:2}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,pSVar2,(char (*) [8])0x131844,0x545);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw:1[a]}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:1[a]}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[11]>(test,pSVar2,(char (*) [11])"{raw:1[a]}",0x549)
  ;
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw:1[b]}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:1[b]}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[11]>(test,pSVar2,(char (*) [11])"{raw:1[b]}",0x54d)
  ;
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  JSON::Parse<char>(&local_70,"[\"A\", \"abc\", true, 456, 1.5]");
  Value<char>::operator=((Value<char> *)&content,&local_70);
  Value<char>::~Value(&local_70);
  local_40 = "{raw:0";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:0",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(test,pSVar2,(char (*) [7])"{raw:0",0x555);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(test,pSVar2,(char (*) [7])0x13199f,0x559);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{r}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{r}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(test,pSVar2,(char (*) [4])"{r}",0x55d);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{ra}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{ra}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[5]>(test,pSVar2,(char (*) [5])"{ra}",0x561);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(test,pSVar2,(char (*) [6])"{raw}",0x565);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw:}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(test,pSVar2,(char (*) [7])"{raw:}",0x569);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{r:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{r:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(test,pSVar2,(char (*) [6])"{r:0}",0x56d);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{ra:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{ra:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(test,pSVar2,(char (*) [7])"{ra:0}",0x571);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw:0{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:0{raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,pSVar2,(char (*) [8])"{raw:0A",0x577);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "raw:0{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("raw:0{raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(test,pSVar2,(char (*) [7])0x131ab1,0x57b);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "raw:0}{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("raw:0}{raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,pSVar2,(char (*) [8])"raw:0}A",0x57f);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw:0{raw:0}{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:0{raw:0}{raw:0}",(Value<char> *)&content,
                      (StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(test,pSVar2,(char (*) [9])"{raw:0AA",0x583);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw:1{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:1{raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,pSVar2,(char (*) [8])"{raw:1A",0x589);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "raw:1{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("raw:1{raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(test,pSVar2,(char (*) [7])0x131aed,0x58d);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "raw:1}{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("raw:1}{raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,pSVar2,(char (*) [8])"raw:1}A",0x591);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw:1{raw:0}{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:1{raw:0}{raw:0}",(Value<char> *)&content,
                      (StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(test,pSVar2,(char (*) [9])"{raw:1AA",0x595);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{{raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[3]>(test,pSVar2,(char (*) [3])"{A",0x59b);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{{raw:0}{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{{raw:0}{raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(test,pSVar2,(char (*) [4])"{AA",0x59f);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{r{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{r{raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(test,pSVar2,(char (*) [4])"{rA",0x5a3);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{r{raw:0}{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{r{raw:0}{raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_)
  ;
  QTest::IsEqual<Qentem::StringStream<char>,char[5]>(test,pSVar2,(char (*) [5])"{rAA",0x5a7);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{ra{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{ra{raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[5]>(test,pSVar2,(char (*) [5])"{raA",0x5ab);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{ra{raw:0}{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{ra{raw:0}{raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(test,pSVar2,(char (*) [6])"{raAA",0x5af);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw{raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(test,pSVar2,(char (*) [6])"{rawA",0x5b3);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw{raw:0}{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw{raw:0}{raw:0}",(Value<char> *)&content,
                      (StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(test,pSVar2,(char (*) [7])"{rawAA",0x5b7);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{-{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{-{raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(test,pSVar2,(char (*) [4])"{-A",0x5bd);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{-{raw:0}{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{-{raw:0}{raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_)
  ;
  QTest::IsEqual<Qentem::StringStream<char>,char[5]>(test,pSVar2,(char (*) [5])"{-AA",0x5c1);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{r-{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{r-{raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[5]>(test,pSVar2,(char (*) [5])"{r-A",0x5c5);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{r-{raw:0}{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{r-{raw:0}{raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(test,pSVar2,(char (*) [6])"{r-AA",0x5c9);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{ra-{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{ra-{raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(test,pSVar2,(char (*) [6])"{ra-A",0x5cd);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{ra-{raw:0}{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{ra-{raw:0}{raw:0}",(Value<char> *)&content,
                      (StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(test,pSVar2,(char (*) [7])"{ra-AA",0x5d1);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw-{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw-{raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(test,pSVar2,(char (*) [7])"{raw-A",0x5d5);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw-{raw:0}{raw:0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw-{raw:0}{raw:0}",(Value<char> *)&content,
                      (StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,pSVar2,(char (*) [8])"{raw-AA",0x5d9);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw-0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw-0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,pSVar2,(char (*) [8])"{raw-0}",0x5df);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw 0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw 0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,pSVar2,(char (*) [8])"{raw 0}",0x5e3);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw:0 }";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:0 }",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(test,pSVar2,(char (*) [9])"{raw:0 }",0x5e7);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw:0 ";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:0 ",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,pSVar2,(char (*) [8])"{raw:0 ",0x5eb);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{raw:0";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:0",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(test,pSVar2,(char (*) [7])"{raw:0",0x5ef);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{ raw-0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{ raw-0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(test,pSVar2,(char (*) [9])"{ raw-0}",0x5f3);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{ raw 0}";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{ raw 0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(test,pSVar2,(char (*) [9])"{ raw 0}",0x5f7);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{ raw:0 }";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{ raw:0 }",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[10]>(test,pSVar2,(char (*) [10])"{ raw:0 }",0x5fb);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{ raw:0 ";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{ raw:0 ",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(test,pSVar2,(char (*) [9])"{ raw:0 ",0x5ff);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  local_40 = "{ raw:0";
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{ raw:0",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,pSVar2,(char (*) [8])"{ raw:0",0x603);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::~Value((Value<char> *)&content);
  StringStream<char>::~StringStream((StringStream<char> *)&value.type_);
  return;
}

Assistant:

static void TestRawVariableTag3(QTest &test) {
    StringStream<char> ss;
    Value<char>        value;
    const char        *content;

    content = R"({raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:0})", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(R"({raw:a})", value, ss), R"({raw:a})", __LINE__);
    ss.Clear();

    content = R"({raw:0[0]})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), R"({raw:0[0]})", __LINE__);
    ss.Clear();

    content = R"({raw:a[0]})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), R"({raw:a[0]})", __LINE__);
    ss.Clear();

    content = R"({raw:0[a]})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), R"({raw:0[a]})", __LINE__);
    ss.Clear();

    content = R"({raw:a[abc]})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), R"({raw:a[abc]})", __LINE__);
    ss.Clear();

    ////////////////

    value = JSON::Parse(R"([[[]],{"a":["x"],"b":{"a":"X"}}])");

    content = R"({raw:0})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), R"({raw:0})", __LINE__);
    ss.Clear();

    content = R"({raw:0[0]})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:0[0]})", __LINE__);
    ss.Clear();

    content = R"({raw:0[0][0]})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:0[0][0]})", __LINE__);
    ss.Clear();

    /////

    content = R"({raw:1})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:1})", __LINE__);
    ss.Clear();

    content = R"({raw:2})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:2})", __LINE__);
    ss.Clear();

    content = R"({raw:1[a]})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:1[a]})", __LINE__);
    ss.Clear();

    content = R"({raw:1[b]})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:1[b]})", __LINE__);
    ss.Clear();

    ////

    value = JSON::Parse(R"(["A", "abc", true, 456, 1.5])");

    content = R"({raw:0)";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:0)", __LINE__);
    ss.Clear();

    content = R"(raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"(raw:0})", __LINE__);
    ss.Clear();

    content = R"({r})";
    test.IsEqual(Template::Render(content, value, ss), R"({r})", __LINE__);
    ss.Clear();

    content = R"({ra})";
    test.IsEqual(Template::Render(content, value, ss), R"({ra})", __LINE__);
    ss.Clear();

    content = R"({raw})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw})", __LINE__);
    ss.Clear();

    content = R"({raw:})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:})", __LINE__);
    ss.Clear();

    content = R"({r:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({r:0})", __LINE__);
    ss.Clear();

    content = R"({ra:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({ra:0})", __LINE__);
    ss.Clear();

    ////

    content = R"({raw:0{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:0A)", __LINE__);
    ss.Clear();

    content = R"(raw:0{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"(raw:0A)", __LINE__);
    ss.Clear();

    content = R"(raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"(raw:0}A)", __LINE__);
    ss.Clear();

    content = R"({raw:0{raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:0AA)", __LINE__);
    ss.Clear();

    ////

    content = R"({raw:1{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:1A)", __LINE__);
    ss.Clear();

    content = R"(raw:1{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"(raw:1A)", __LINE__);
    ss.Clear();

    content = R"(raw:1}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"(raw:1}A)", __LINE__);
    ss.Clear();

    content = R"({raw:1{raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:1AA)", __LINE__);
    ss.Clear();

    ////

    content = R"({{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({A)", __LINE__);
    ss.Clear();

    content = R"({{raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({AA)", __LINE__);
    ss.Clear();

    content = R"({r{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({rA)", __LINE__);
    ss.Clear();

    content = R"({r{raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({rAA)", __LINE__);
    ss.Clear();

    content = R"({ra{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({raA)", __LINE__);
    ss.Clear();

    content = R"({ra{raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({raAA)", __LINE__);
    ss.Clear();

    content = R"({raw{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({rawA)", __LINE__);
    ss.Clear();

    content = R"({raw{raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({rawAA)", __LINE__);
    ss.Clear();

    ///

    content = R"({-{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({-A)", __LINE__);
    ss.Clear();

    content = R"({-{raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({-AA)", __LINE__);
    ss.Clear();

    content = R"({r-{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({r-A)", __LINE__);
    ss.Clear();

    content = R"({r-{raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({r-AA)", __LINE__);
    ss.Clear();

    content = R"({ra-{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({ra-A)", __LINE__);
    ss.Clear();

    content = R"({ra-{raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({ra-AA)", __LINE__);
    ss.Clear();

    content = R"({raw-{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw-A)", __LINE__);
    ss.Clear();

    content = R"({raw-{raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw-AA)", __LINE__);
    ss.Clear();

    //

    content = R"({raw-0})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw-0})", __LINE__);
    ss.Clear();

    content = R"({raw 0})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw 0})", __LINE__);
    ss.Clear();

    content = R"({raw:0 })";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:0 })", __LINE__);
    ss.Clear();

    content = R"({raw:0 )";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:0 )", __LINE__);
    ss.Clear();

    content = R"({raw:0)";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:0)", __LINE__);
    ss.Clear();

    content = R"({ raw-0})";
    test.IsEqual(Template::Render(content, value, ss), R"({ raw-0})", __LINE__);
    ss.Clear();

    content = R"({ raw 0})";
    test.IsEqual(Template::Render(content, value, ss), R"({ raw 0})", __LINE__);
    ss.Clear();

    content = R"({ raw:0 })";
    test.IsEqual(Template::Render(content, value, ss), R"({ raw:0 })", __LINE__);
    ss.Clear();

    content = R"({ raw:0 )";
    test.IsEqual(Template::Render(content, value, ss), R"({ raw:0 )", __LINE__);
    ss.Clear();

    content = R"({ raw:0)";
    test.IsEqual(Template::Render(content, value, ss), R"({ raw:0)", __LINE__);
    ss.Clear();
}